

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O2

Descriptor * upb_test::AddMessageDescriptor(MessageDefPtr msgdef,DescriptorPool *pool)

{
  upb_FileDef *f;
  google_protobuf_FileDescriptorProto *msg;
  char *pcVar1;
  FileDescriptor *pFVar2;
  size_t sVar3;
  Descriptor *pDVar4;
  char *in_R9;
  string_view name;
  AssertHelper AStack_168;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_160;
  Arena tmp_arena;
  size_t size;
  string local_140;
  AssertionResult gtest_ar_;
  FileDescriptorProto google_proto;
  
  tmp_arena.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
  super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
  super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl = upb_Arena_New();
  tmp_arena.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
  super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
  super__Tuple_impl<1UL,_void_(*)(upb_Arena_*)>.super__Head_base<1UL,_void_(*)(upb_Arena_*),_false>.
  _M_head_impl = (_Head_base<1UL,_void_(*)(upb_Arena_*),_false>)upb_Arena_Free;
  f = upb_MessageDef_File(msgdef.ptr_);
  msg = upb_FileDef_ToProto(f,tmp_arena.ptr_._M_t.
                              super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                              super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                              super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl);
  pcVar1 = google_protobuf_FileDescriptorProto_serialize
                     (msg,tmp_arena.ptr_._M_t.
                          super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                          super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                          super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl,&size);
  google::protobuf::FileDescriptorProto::FileDescriptorProto(&google_proto);
  google::protobuf::MessageLite::ParseFromArray((MessageLite *)&google_proto,pcVar1,(int)size);
  pFVar2 = google::protobuf::DescriptorPool::BuildFile(pool,&google_proto);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = pFVar2 != (FileDescriptor *)0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_140,(internal *)&gtest_ar_,(AssertionResult *)"file_desc != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.cc"
               ,0x2d,local_140._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    std::__cxx11::string::~string((string *)&local_140);
    if (local_160._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_160._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  pcVar1 = upb_MessageDef_FullName(msgdef.ptr_);
  sVar3 = strlen(pcVar1);
  name._M_str = pcVar1;
  name._M_len = sVar3;
  pDVar4 = google::protobuf::DescriptorPool::FindMessageTypeByName(pool,name);
  google::protobuf::FileDescriptorProto::~FileDescriptorProto(&google_proto);
  std::unique_ptr<upb_Arena,_void_(*)(upb_Arena_*)>::~unique_ptr(&tmp_arena.ptr_);
  return pDVar4;
}

Assistant:

const google::protobuf::Descriptor* AddMessageDescriptor(
    upb::MessageDefPtr msgdef, google::protobuf::DescriptorPool* pool) {
  upb::Arena tmp_arena;
  upb::FileDefPtr file = msgdef.file();
  google_protobuf_FileDescriptorProto* upb_proto =
      upb_FileDef_ToProto(file.ptr(), tmp_arena.ptr());
  size_t size;
  const char* buf = google_protobuf_FileDescriptorProto_serialize(
      upb_proto, tmp_arena.ptr(), &size);
  google::protobuf::FileDescriptorProto google_proto;
  google_proto.ParseFromArray(buf, size);
  const google::protobuf::FileDescriptor* file_desc =
      pool->BuildFile(google_proto);
  EXPECT_TRUE(file_desc != nullptr);
  return pool->FindMessageTypeByName(msgdef.full_name());
}